

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr term_win_init(term_win *s,wchar_t w,wchar_t h)

{
  int **ppiVar1;
  wchar_t **ppwVar2;
  int *piVar3;
  wchar_t *pwVar4;
  wchar_t local_1c;
  wchar_t y;
  wchar_t h_local;
  wchar_t w_local;
  term_win *s_local;
  
  ppiVar1 = (int **)mem_zalloc((long)h << 3);
  s->a = ppiVar1;
  ppwVar2 = (wchar_t **)mem_zalloc((long)h << 3);
  s->c = ppwVar2;
  piVar3 = (int *)mem_zalloc((long)(h * w) << 2);
  s->va = piVar3;
  pwVar4 = (wchar_t *)mem_zalloc((long)(h * w) << 2);
  s->vc = pwVar4;
  ppiVar1 = (int **)mem_zalloc((long)h << 3);
  s->ta = ppiVar1;
  ppwVar2 = (wchar_t **)mem_zalloc((long)h << 3);
  s->tc = ppwVar2;
  piVar3 = (int *)mem_zalloc((long)(h * w) << 2);
  s->vta = piVar3;
  pwVar4 = (wchar_t *)mem_zalloc((long)(h * w) << 2);
  s->vtc = pwVar4;
  for (local_1c = L'\0'; local_1c < h; local_1c = local_1c + L'\x01') {
    s->a[local_1c] = s->va + w * local_1c;
    s->c[local_1c] = s->vc + w * local_1c;
    s->ta[local_1c] = s->vta + w * local_1c;
    s->tc[local_1c] = s->vtc + w * local_1c;
  }
  return 0;
}

Assistant:

static errr term_win_init(term_win *s, int w, int h)
{
	int y;

	/* Make the window access arrays */
	s->a = mem_zalloc_alt(h * sizeof(int*));
	s->c = mem_zalloc_alt(h * sizeof(wchar_t*));

	/* Make the window content arrays */
	s->va = mem_zalloc_alt(h * w * sizeof(int));
	s->vc = mem_zalloc_alt(h * w * sizeof(wchar_t));

	/* Make the terrain access arrays */
	s->ta = mem_zalloc_alt(h * sizeof(int*));
	s->tc = mem_zalloc_alt(h * sizeof(wchar_t*));

	/* Make the terrain content arrays */
	s->vta = mem_zalloc_alt(h * w * sizeof(int));
	s->vtc = mem_zalloc_alt(h * w * sizeof(wchar_t));

	/* Prepare the window access arrays */
	for (y = 0; y < h; y++) {
		s->a[y] = s->va + w * y;
		s->c[y] = s->vc + w * y;

		s->ta[y] = s->vta + w * y;
		s->tc[y] = s->vtc + w * y;
	}

	/* Success */
	return (0);
}